

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alphabet.c
# Opt level: O2

void vrna_ptypes_prepare(vrna_fold_compound_t *fc,uint options)

{
  char *pcVar1;
  char **ppcVar2;
  
  if (fc != (vrna_fold_compound_t *)0x0) {
    if (((options & 1) != 0) && (fc->type == VRNA_FC_TYPE_SINGLE)) {
      if ((options & 0x10) == 0) {
        if ((fc->field_23).field_0.ptype == (char *)0x0) {
          pcVar1 = vrna_ptypes((fc->field_23).field_0.sequence_encoding2,&fc->params->model_details)
          ;
          (fc->field_23).field_0.ptype = pcVar1;
        }
      }
      else {
        ppcVar2 = (char **)vrna_realloc(fc->ptype_local,fc->length * 8 + 8);
        fc->ptype_local = ppcVar2;
      }
    }
    if (((options & 2) != 0) && (fc->type == VRNA_FC_TYPE_SINGLE)) {
      if ((options & 0x10) == 0) {
        if ((fc->field_23).field_0.ptype == (char *)0x0) {
          pcVar1 = vrna_ptypes((fc->field_23).field_0.sequence_encoding2,
                               &fc->exp_params->model_details);
          (fc->field_23).field_0.ptype = pcVar1;
        }
        if ((fc->field_23).field_0.ptype_pf_compat == (char *)0x0) {
          pcVar1 = get_ptypes((fc->field_23).field_0.sequence_encoding2,
                              &fc->exp_params->model_details,1);
          (fc->field_23).field_0.ptype_pf_compat = pcVar1;
        }
      }
      else {
        ppcVar2 = (char **)vrna_realloc(fc->ptype_local,fc->length * 8 + 8);
        fc->ptype_local = ppcVar2;
      }
    }
  }
  return;
}

Assistant:

PUBLIC void
vrna_ptypes_prepare(vrna_fold_compound_t  *fc,
                    unsigned int          options)
{
  if (!fc)
    return;

  if (options & VRNA_OPTION_MFE) {
    switch (fc->type) {
      case VRNA_FC_TYPE_SINGLE:
        if (options & VRNA_OPTION_WINDOW) {
          fc->ptype_local =
            (char **)vrna_realloc(fc->ptype_local, sizeof(char *) * (fc->length + 1));
        } else {
          if (!fc->ptype)
            fc->ptype = vrna_ptypes(fc->sequence_encoding2,
                                    &(fc->params->model_details));
        }

        break;

      case VRNA_FC_TYPE_COMPARATIVE:
        break;

      default:
        break;
    }
  }

  if (options & VRNA_OPTION_PF) {
    switch (fc->type) {
      case VRNA_FC_TYPE_SINGLE:
        if (options & VRNA_OPTION_WINDOW) {
          fc->ptype_local =
            (char **)vrna_realloc(fc->ptype_local, sizeof(char *) * (fc->length + 1));
        } else {
          if (!fc->ptype)
            fc->ptype = vrna_ptypes(fc->sequence_encoding2, &(fc->exp_params->model_details));

#ifndef VRNA_DISABLE_BACKWARD_COMPATIBILITY
          /* backward compatibility ptypes */
          if (!fc->ptype_pf_compat)
            fc->ptype_pf_compat = get_ptypes(fc->sequence_encoding2,
                                             &(fc->exp_params->model_details),
                                             1);

#endif
        }

        break;

      case VRNA_FC_TYPE_COMPARATIVE:
        break;

      default:
        break;
    }
  }
}